

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::Insert(HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,LightHandle *key,LightBVHNode **value)

{
  bool bVar1;
  reference this_00;
  memory_resource *pmVar2;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar3;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  *in_RDI;
  LightHandle *in_stack_00000008;
  HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  *in_stack_00000010;
  size_t offset;
  HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  *in_stack_00000060;
  pair<pbrt::LightHandle,_pbrt::LightBVHNode_*> *in_stack_ffffffffffffffb8;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *in_stack_ffffffffffffffc0;
  size_type local_20;
  
  local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
  this_00 = pstd::
            vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
            ::operator[](in_RDI,local_20);
  bVar1 = pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>::has_value(this_00);
  if (!bVar1) {
    pmVar2 = (memory_resource *)((long)&(in_RDI[1].alloc.memoryResource)->_vptr_memory_resource + 1)
    ;
    in_RDI[1].alloc.memoryResource = pmVar2;
    in_stack_ffffffffffffffc0 =
         (optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)((long)pmVar2 * 3);
    poVar3 = (optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)
             capacity((HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
                       *)0x84ef7c);
    if (poVar3 < in_stack_ffffffffffffffc0) {
      Grow(in_stack_00000060);
      local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
    }
  }
  std::make_pair<pbrt::LightHandle_const&,pbrt::LightBVHNode*const&>
            ((LightHandle *)in_RDI,(LightBVHNode **)in_stack_ffffffffffffffc0);
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  ::operator[](in_RDI,local_20);
  pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Not there already; possibly grow.
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }